

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

qsizetype QtPrivate::count(QStringView haystack,QStringView needle,CaseSensitivity cs)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  QStringMatcher matcher;
  QStringMatcher local_170;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (haystack.m_size < 0x1f5 || needle.m_size < 6) {
    lVar2 = -1;
    lVar1 = -1;
    do {
      lVar1 = findString(haystack,lVar1 + 1,needle,cs);
      lVar2 = lVar2 + 1;
    } while (lVar1 != -1);
  }
  else {
    memset(&local_170,0xaa,0x138);
    QStringMatcher::QStringMatcher(&local_170,needle,cs);
    lVar2 = -1;
    lVar1 = -1;
    do {
      if (lVar1 < 0) {
        lVar1 = -1;
      }
      lVar1 = bm_find(haystack,lVar1 + 1,local_170.q_sv,local_170.q_skiptable,local_170.q_cs);
      lVar2 = lVar2 + 1;
    } while (lVar1 != -1);
    QStringMatcher::~QStringMatcher(&local_170);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return lVar2;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::count(QStringView haystack, QStringView needle, Qt::CaseSensitivity cs) noexcept
{
    qsizetype num = 0;
    qsizetype i = -1;
    if (haystack.size() > 500 && needle.size() > 5) {
        QStringMatcher matcher(needle, cs);
        while ((i = matcher.indexIn(haystack, i + 1)) != -1)
            ++num;
    } else {
        while ((i = QtPrivate::findString(haystack, i + 1, needle, cs)) != -1)
            ++num;
    }
    return num;
}